

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

hugeint_t duckdb::DecimalScaleDownOperator::Operation<short,duckdb::hugeint_t>
                    (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  short sVar2;
  DecimalScaleInput<short,_short> *data;
  undefined6 in_register_0000003a;
  hugeint_t hVar3;
  
  sVar2 = (short)((long)((ulong)(uint)((int)CONCAT62(in_register_0000003a,input) >> 0x1f) << 0x20 |
                        CONCAT62(in_register_0000003a,input) & 0xffffffff) /
                 (long)(int)(*(short *)((long)dataptr + 0x22) / 2));
  sVar1 = sVar2 + 1;
  if (sVar2 < 0) {
    sVar1 = sVar2 + -1;
  }
  hVar3 = Cast::Operation<short,duckdb::hugeint_t>(sVar1 / 2);
  return hVar3;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}